

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPPacket::BuildPacket
          (RTPPacket *this,uint8_t payloadtype,void *payloaddata,size_t payloadlen,uint16_t seqnr,
          uint32_t timestamp,uint32_t ssrc,bool gotmarker,uint8_t numcsrcs,uint32_t *csrcs,
          bool gotextension,uint16_t extensionid,uint16_t extensionlen_numwords,void *extensiondata,
          void *buffer,size_t maxsize)

{
  uint uVar1;
  uint8_t *puVar2;
  RTPMemoryManager *pRVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  ushort *__dest;
  
  if (0xf < numcsrcs) {
    return -0x1a;
  }
  if ((payloadtype & 0x7e) == 0x48 || (char)payloadtype < '\0') {
    return -0x15;
  }
  uVar4 = (ulong)((uint)numcsrcs * 4 & 0xff);
  lVar5 = uVar4 + (ulong)extensionlen_numwords * 4 + 0x10;
  if (!gotextension) {
    lVar5 = uVar4 + 0xc;
  }
  uVar6 = lVar5 + payloadlen;
  this->packetlength = uVar6;
  if ((maxsize != 0) && (maxsize < uVar6)) {
    this->packetlength = 0;
    return -0x16;
  }
  bVar7 = true;
  if (buffer == (void *)0x0) {
    pRVar3 = (this->super_RTPMemoryObject).mgr;
    if (pRVar3 != (RTPMemoryManager *)0x0) {
      buffer = (void *)(**(code **)(*(long *)pRVar3 + 0x10))(pRVar3,uVar6,8);
      this->packet = (uint8_t *)buffer;
      if ((ushort *)buffer == (ushort *)0x0) {
        this->packetlength = 0;
        return -1;
      }
      bVar7 = false;
      goto LAB_0012d339;
    }
    buffer = operator_new__(uVar6);
    bVar7 = false;
  }
  this->packet = (uint8_t *)buffer;
LAB_0012d339:
  this->externalbuffer = bVar7;
  this->hasmarker = gotmarker;
  this->hasextension = gotextension;
  this->numcsrcs = (uint)numcsrcs;
  this->payloadtype = payloadtype;
  this->extseqnr = (uint)seqnr;
  this->timestamp = timestamp;
  this->ssrc = ssrc;
  this->payloadlength = payloadlen;
  this->extid = extensionid;
  this->extensionlength = (ulong)extensionlen_numwords * 4;
  *(ushort *)buffer =
       (ushort)payloadtype << 8 |
       ((ushort)gotextension << 4 | (ushort)(byte)~gotmarker << 0xf) + (ushort)numcsrcs + 0x8080;
  *(uint16_t *)((long)buffer + 2) = seqnr << 8 | seqnr >> 8;
  *(uint32_t *)((long)buffer + 4) =
       timestamp >> 0x18 | (timestamp & 0xff0000) >> 8 | (timestamp & 0xff00) << 8 |
       timestamp << 0x18;
  *(uint32_t *)((long)buffer + 8) =
       ssrc >> 0x18 | (ssrc & 0xff0000) >> 8 | (ssrc & 0xff00) << 8 | ssrc << 0x18;
  puVar2 = this->packet;
  if (numcsrcs != '\0') {
    uVar6 = 0;
    do {
      uVar1 = csrcs[uVar6];
      *(uint *)(puVar2 + uVar6 * 4 + 0xc) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar6 = uVar6 + 1;
    } while (numcsrcs != uVar6);
  }
  __dest = (ushort *)(puVar2 + uVar4 + 0xc);
  this->payload = (uint8_t *)__dest;
  if (gotextension) {
    *__dest = extensionid << 8 | extensionid >> 8;
    __dest[1] = extensionlen_numwords << 8 | extensionlen_numwords >> 8;
    this->payload = (uint8_t *)(__dest + 2);
    memcpy(__dest + 2,extensiondata,this->extensionlength);
    __dest = (ushort *)(this->payload + this->extensionlength);
    this->payload = (uint8_t *)__dest;
  }
  memcpy(__dest,payloaddata,payloadlen);
  return 0;
}

Assistant:

int RTPPacket::BuildPacket(uint8_t payloadtype,const void *payloaddata,size_t payloadlen,uint16_t seqnr,
		  uint32_t timestamp,uint32_t ssrc,bool gotmarker,uint8_t numcsrcs,const uint32_t *csrcs,
		  bool gotextension,uint16_t extensionid,uint16_t extensionlen_numwords,const void *extensiondata,
		  void *buffer,size_t maxsize)
{
	if (numcsrcs > RTP_MAXCSRCS)
		return ERR_RTP_PACKET_TOOMANYCSRCS;

	if (payloadtype > 127) // high bit should not be used
		return ERR_RTP_PACKET_BADPAYLOADTYPE;
	if (payloadtype == 72 || payloadtype == 73) // could cause confusion with rtcp types
		return ERR_RTP_PACKET_BADPAYLOADTYPE;
	
	packetlength = sizeof(RTPHeader);
	packetlength += sizeof(uint32_t)*((size_t)numcsrcs);
	if (gotextension)
	{
		packetlength += sizeof(RTPExtensionHeader);
		packetlength += sizeof(uint32_t)*((size_t)extensionlen_numwords);
	}
	packetlength += payloadlen;

	if (maxsize > 0 && packetlength > maxsize)
	{
		packetlength = 0;
		return ERR_RTP_PACKET_DATAEXCEEDSMAXSIZE;
	}

	// Ok, now we'll just fill in...
	
	RTPHeader *rtphdr;
	
	if (buffer == 0)
	{
		packet = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTPPACKET) uint8_t [packetlength];
		if (packet == 0)
		{
			packetlength = 0;
			return ERR_RTP_OUTOFMEM;
		}
		externalbuffer = false;
	}
	else
	{
		packet = (uint8_t *)buffer;
		externalbuffer = true;
	}
	
	RTPPacket::hasmarker = gotmarker;
	RTPPacket::hasextension = gotextension;
	RTPPacket::numcsrcs = numcsrcs;
	RTPPacket::payloadtype = payloadtype;
	RTPPacket::extseqnr = (uint32_t)seqnr;
	RTPPacket::timestamp = timestamp;
	RTPPacket::ssrc = ssrc;
	RTPPacket::payloadlength = payloadlen;
	RTPPacket::extid = extensionid;
	RTPPacket::extensionlength = ((size_t)extensionlen_numwords)*sizeof(uint32_t);
	
	rtphdr = (RTPHeader *)packet;
	rtphdr->version = RTP_VERSION;
	rtphdr->padding = 0;
	if (gotmarker)
		rtphdr->marker = 1;
	else
		rtphdr->marker = 0;
	if (gotextension)
		rtphdr->extension = 1;
	else
		rtphdr->extension = 0;
	rtphdr->csrccount = numcsrcs;
	rtphdr->payloadtype = payloadtype&127; // make sure high bit isn't set
	rtphdr->sequencenumber = htons(seqnr);
	rtphdr->timestamp = htonl(timestamp);
	rtphdr->ssrc = htonl(ssrc);
	
	uint32_t *curcsrc;
	int i;

	curcsrc = (uint32_t *)(packet+sizeof(RTPHeader));
	for (i = 0 ; i < numcsrcs ; i++,curcsrc++)
		*curcsrc = htonl(csrcs[i]);

	payload = packet+sizeof(RTPHeader)+((size_t)numcsrcs)*sizeof(uint32_t); 
	if (gotextension)
	{
		RTPExtensionHeader *rtpexthdr = (RTPExtensionHeader *)payload;

		rtpexthdr->extid = htons(extensionid);
		rtpexthdr->length = htons((uint16_t)extensionlen_numwords);
		
		payload += sizeof(RTPExtensionHeader);
		memcpy(payload,extensiondata,RTPPacket::extensionlength);
		
		payload += RTPPacket::extensionlength;
	}
	memcpy(payload,payloaddata,payloadlen);
	return 0;
}